

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O0

void __thiscall
JetHead::list<Timer::TimerNode>::push_back(list<Timer::TimerNode> *this,TimerNode *val)

{
  Node *this_00;
  Node *newTail;
  TimerNode *val_local;
  list<Timer::TimerNode> *this_local;
  
  this_00 = (Node *)operator_new(0x38,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                 ,0xa7);
  Node::Node(this_00);
  Timer::TimerNode::operator=((TimerNode *)this_00,val);
  this_00->prev = this->mTail->prev;
  this_00->next = this->mTail;
  this->mTail->prev->next = this_00;
  this->mTail->prev = this_00;
  return;
}

Assistant:

void push_back(const T& val)
		{
			Node* newTail = jh_new Node;
			newTail->val = val;
			newTail->prev = mTail->prev;
			newTail->next = mTail;

			mTail->prev->next = newTail;
			mTail->prev = newTail;
		}